

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void triangle_points_plot
               (char *file_name,double *node_xy,int node_show,int point_num,double *point_xy,
               int point_show)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double y_scale;
  int local_298;
  int y_ps_min_clip;
  int y_ps_min;
  int y_ps_max_clip;
  int y_ps_max;
  int y_ps;
  double y_min;
  double y_max;
  double x_scale;
  int local_268;
  int x_ps_min_clip;
  int x_ps_min;
  int x_ps_max_clip;
  int x_ps_max;
  int x_ps;
  double x_min;
  double x_max;
  int point;
  int node_num;
  int node;
  int i;
  ofstream file_unit;
  int local_30;
  int delta;
  int circle_size;
  int point_show_local;
  double *point_xy_local;
  int point_num_local;
  int node_show_local;
  double *node_xy_local;
  char *file_name_local;
  
  std::ofstream::ofstream(&node);
  x_ps_min = 0x240;
  x_ps_min_clip = 0x252;
  local_268 = 0x24;
  x_scale._4_4_ = 0x12;
  y_ps_min = 0x29a;
  y_ps_min_clip = 0x2ac;
  local_298 = 0x7e;
  y_scale._4_4_ = 0x6c;
  dVar5 = r8_huge();
  x_min = -dVar5;
  for (point = 0; point < 3; point = point + 1) {
    if (x_min < node_xy[point << 1]) {
      x_min = node_xy[point << 1];
    }
  }
  for (x_max._0_4_ = 0; x_max._0_4_ < point_num; x_max._0_4_ = x_max._0_4_ + 1) {
    if (x_min < point_xy[x_max._0_4_ << 1]) {
      x_min = point_xy[x_max._0_4_ << 1];
    }
  }
  _x_ps_max = r8_huge();
  for (point = 0; point < 3; point = point + 1) {
    if (node_xy[point << 1] < _x_ps_max) {
      _x_ps_max = node_xy[point << 1];
    }
  }
  for (x_max._0_4_ = 0; x_max._0_4_ < point_num; x_max._0_4_ = x_max._0_4_ + 1) {
    if (point_xy[x_max._0_4_ << 1] < _x_ps_max) {
      _x_ps_max = point_xy[x_max._0_4_ << 1];
    }
  }
  dVar5 = (x_min - _x_ps_max) * 0.05 + x_min;
  _x_ps_max = (x_min - _x_ps_max) * -0.05 + _x_ps_max;
  dVar6 = dVar5 - _x_ps_max;
  dVar7 = r8_huge();
  y_min = -dVar7;
  for (point = 0; point < 3; point = point + 1) {
    if (y_min < node_xy[point * 2 + 1]) {
      y_min = node_xy[point * 2 + 1];
    }
  }
  for (x_max._0_4_ = 0; x_max._0_4_ < point_num; x_max._0_4_ = x_max._0_4_ + 1) {
    if (y_min < point_xy[x_max._0_4_ * 2 + 1]) {
      y_min = point_xy[x_max._0_4_ * 2 + 1];
    }
  }
  _y_ps_max = r8_huge();
  for (point = 0; point < 3; point = point + 1) {
    if (node_xy[point * 2 + 1] < _y_ps_max) {
      _y_ps_max = node_xy[point * 2 + 1];
    }
  }
  for (x_max._0_4_ = 0; x_max._0_4_ < point_num; x_max._0_4_ = x_max._0_4_ + 1) {
    if (point_xy[x_max._0_4_ * 2 + 1] < _y_ps_max) {
      _y_ps_max = point_xy[x_max._0_4_ * 2 + 1];
    }
  }
  dVar7 = (y_min - _y_ps_max) * 0.05 + y_min;
  _y_ps_max = (y_min - _y_ps_max) * -0.05 + _y_ps_max;
  dVar8 = dVar7 - _y_ps_max;
  if (dVar8 <= dVar6) {
    if (dVar8 < dVar6) {
      iVar2 = r8_nint(((dVar6 - dVar8) * 540.0) / (dVar6 + dVar6));
      y_ps_min = 0x29a - iVar2;
      local_298 = iVar2 + 0x7e;
      y_ps_min_clip = 0x2ac - iVar2;
      y_scale._4_4_ = iVar2 + 0x6c;
    }
  }
  else {
    iVar2 = r8_nint(((dVar8 - dVar6) * 540.0) / (dVar8 + dVar8));
    x_ps_min = 0x240 - iVar2;
    local_268 = iVar2 + 0x24;
    x_ps_min_clip = 0x252 - iVar2;
    x_scale._4_4_ = iVar2 + 0x12;
  }
  std::ofstream::open(&node,file_name,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&node + *(long *)(_node + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"TRIANGLE_POINTS_PLOT - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Could not open the output EPS file.\n");
    exit(1);
  }
  std::operator<<((ostream *)&node,"%//PS-Adobe-3.0 EPSF-3.0\n");
  std::operator<<((ostream *)&node,"%%Creator: triangulation_order3_plot.C\n");
  poVar4 = std::operator<<((ostream *)&node,"%%Title: ");
  poVar4 = std::operator<<(poVar4,file_name);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&node,"%%Pages: 1\n");
  poVar4 = std::operator<<((ostream *)&node,"%%BoundingBox:  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_268);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_298);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,x_ps_min);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_ps_min);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&node,"%%Document-Fonts: Times-Roman\n");
  std::operator<<((ostream *)&node,"%%LanguageLevel: 1\n");
  std::operator<<((ostream *)&node,"%%EndComments\n");
  std::operator<<((ostream *)&node,"%%BeginProlog\n");
  std::operator<<((ostream *)&node,"/inch {72 mul} def\n");
  std::operator<<((ostream *)&node,"%%EndProlog\n");
  std::operator<<((ostream *)&node,"%%Page: 1 1\n");
  std::operator<<((ostream *)&node,"save\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  Set the RGB line color to very light gray.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"0.900  0.900  0.900 setrgbcolor\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  Draw a gray border around the page.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"newpath\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,local_268);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_298);
  std::operator<<(poVar4,"  moveto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_ps_min);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_298);
  std::operator<<(poVar4,"  lineto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_ps_min);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_ps_min);
  std::operator<<(poVar4,"  lineto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,local_268);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_ps_min);
  std::operator<<(poVar4,"  lineto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,local_268);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_298);
  std::operator<<(poVar4,"  lineto\n");
  std::operator<<((ostream *)&node,"stroke\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  Set the RGB color to black.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"0.000  0.000  0.000 setrgbcolor\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  Set the font and its size.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"/Times-Roman findfont\n");
  std::operator<<((ostream *)&node,"0.50 inch scalefont\n");
  std::operator<<((ostream *)&node,"setfont\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  Print a title.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  210  702  moveto\n");
  std::operator<<((ostream *)&node,"%  (Triangulation)  show\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  Define a clipping polygon.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"newpath\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_scale._4_4_);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_scale._4_4_);
  std::operator<<(poVar4,"  moveto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_ps_min_clip);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_scale._4_4_);
  std::operator<<(poVar4,"  lineto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_ps_min_clip);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_ps_min_clip);
  std::operator<<(poVar4,"  lineto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_scale._4_4_);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_ps_min_clip);
  std::operator<<(poVar4,"  lineto\n");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,x_scale._4_4_);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,y_scale._4_4_);
  std::operator<<(poVar4,"  lineto\n");
  std::operator<<((ostream *)&node,"clip newpath\n");
  if (-1 < node_show) {
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Set the RGB color to red.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"0.900  0.200  0.100 setrgbcolor\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Draw the triangle.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"newpath\n");
    for (node_num = 0; node_num < 4; node_num = node_num + 1) {
      iVar2 = i4_wrap(node_num,0,2);
      iVar3 = r8_nint(((dVar5 - node_xy[iVar2 * 2]) * (double)local_268 +
                      (node_xy[iVar2 * 2] - _x_ps_max) * (double)x_ps_min) / (dVar5 - _x_ps_max));
      iVar2 = r8_nint(((dVar7 - node_xy[(long)(iVar2 * 2) + 1]) * (double)local_298 +
                      (node_xy[(long)(iVar2 * 2) + 1] - _y_ps_max) * (double)y_ps_min) /
                      (dVar7 - _y_ps_max));
      if (node_num == 0) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,iVar3);
        poVar4 = std::operator<<(poVar4,"  ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4,"  moveto\n");
      }
      else {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&node,iVar3);
        poVar4 = std::operator<<(poVar4,"  ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4,"  lineto\n");
      }
    }
    std::operator<<((ostream *)&node,"stroke\n");
  }
  if (0 < node_show) {
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Draw filled dots at the nodes.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Set the RGB color to blue.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"0.000  0.150  0.750 setrgbcolor\n");
    std::operator<<((ostream *)&node,"%\n");
    for (point = 0; point < 3; point = point + 1) {
      iVar2 = r8_nint(((dVar5 - node_xy[point * 2]) * (double)local_268 +
                      (node_xy[point * 2] - _x_ps_max) * (double)x_ps_min) / (dVar5 - _x_ps_max));
      iVar3 = r8_nint(((dVar7 - node_xy[(long)(point * 2) + 1]) * (double)local_298 +
                      (node_xy[(long)(point * 2) + 1] - _y_ps_max) * (double)y_ps_min) /
                      (dVar7 - _y_ps_max));
      poVar4 = std::operator<<((ostream *)&node,"newpath  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,5);
      std::operator<<(poVar4,"  0 360 arc closepath fill\n");
    }
  }
  if (1 < node_show) {
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Label the nodes:\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Set the RGB color to darker blue.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"0.000  0.250  0.850 setrgbcolor\n");
    std::operator<<((ostream *)&node,"/Times-Roman findfont\n");
    std::operator<<((ostream *)&node,"0.20 inch scalefont\n");
    std::operator<<((ostream *)&node,"setfont\n");
    std::operator<<((ostream *)&node,"%\n");
    for (point = 0; point < 3; point = point + 1) {
      iVar2 = r8_nint(((dVar5 - node_xy[point * 2]) * (double)local_268 +
                      (node_xy[point * 2] - _x_ps_max) * (double)x_ps_min) / (dVar5 - _x_ps_max));
      iVar3 = r8_nint(((dVar7 - node_xy[(long)(point * 2) + 1]) * (double)local_298 +
                      (node_xy[(long)(point * 2) + 1] - _y_ps_max) * (double)y_ps_min) /
                      (dVar7 - _y_ps_max));
      poVar4 = std::operator<<((ostream *)&node,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3 + 5);
      poVar4 = std::operator<<(poVar4,"  moveto (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,point + 1);
      std::operator<<(poVar4,") show\n");
    }
  }
  if (point_num < 0xc9) {
    local_30 = 5;
  }
  else if (point_num < 0x1f5) {
    local_30 = 4;
  }
  else if (point_num < 0x3e9) {
    local_30 = 3;
  }
  else if (point_num < 0x1389) {
    local_30 = 2;
  }
  else {
    local_30 = 1;
  }
  if (0 < point_show) {
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Draw filled dots at the points.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Set the RGB color to green.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"0.150  0.750  0.000 setrgbcolor\n");
    std::operator<<((ostream *)&node,"%\n");
    for (x_max._0_4_ = 0; x_max._0_4_ < point_num; x_max._0_4_ = x_max._0_4_ + 1) {
      iVar2 = r8_nint(((dVar5 - point_xy[x_max._0_4_ * 2]) * (double)local_268 +
                      (point_xy[x_max._0_4_ * 2] - _x_ps_max) * (double)x_ps_min) /
                      (dVar5 - _x_ps_max));
      iVar3 = r8_nint(((dVar7 - point_xy[(long)(x_max._0_4_ * 2) + 1]) * (double)local_298 +
                      (point_xy[(long)(x_max._0_4_ * 2) + 1] - _y_ps_max) * (double)y_ps_min) /
                      (dVar7 - _y_ps_max));
      poVar4 = std::operator<<((ostream *)&node,"newpath  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
      std::operator<<(poVar4,"  0 360 arc closepath fill\n");
    }
  }
  if (1 < point_show) {
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Label the point:\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"%  Set the RGB color to darker green.\n");
    std::operator<<((ostream *)&node,"%\n");
    std::operator<<((ostream *)&node,"0.250  0.850  0.000 setrgbcolor\n");
    std::operator<<((ostream *)&node,"/Times-Roman findfont\n");
    std::operator<<((ostream *)&node,"0.20 inch scalefont\n");
    std::operator<<((ostream *)&node,"setfont\n");
    std::operator<<((ostream *)&node,"%\n");
    for (x_max._0_4_ = 0; x_max._0_4_ < point_num; x_max._0_4_ = x_max._0_4_ + 1) {
      iVar2 = r8_nint(((dVar5 - point_xy[x_max._0_4_ * 2]) * (double)local_268 +
                      (point_xy[x_max._0_4_ * 2] - _x_ps_max) * (double)x_ps_min) /
                      (dVar5 - _x_ps_max));
      iVar3 = r8_nint(((dVar7 - point_xy[(long)(x_max._0_4_ * 2) + 1]) * (double)local_298 +
                      (point_xy[(long)(x_max._0_4_ * 2) + 1] - _y_ps_max) * (double)y_ps_min) /
                      (dVar7 - _y_ps_max));
      poVar4 = std::operator<<((ostream *)&node,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3 + 5);
      poVar4 = std::operator<<(poVar4,"  moveto (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,x_max._0_4_ + 1);
      std::operator<<(poVar4,") show\n");
    }
  }
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"restore  showpage\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%  End of page.\n");
  std::operator<<((ostream *)&node,"%\n");
  std::operator<<((ostream *)&node,"%%Trailer\n");
  std::operator<<((ostream *)&node,"%%EOF\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&node);
  return;
}

Assistant:

void triangle_points_plot ( char *file_name, double node_xy[], int node_show, 
  int point_num, double point_xy[], int point_show )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_POINTS_PLOT plots a triangle and some points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, char *FILE_NAME, the name of the output file.
//
//    Input, double NODE_XY[2*3], the coordinates of the nodes
//    of the triangle.
//
//    Input, int NODE_SHOW,
//   -1, do not show the triangle, or the nodes.
//    0, show the triangle, do not show the nodes;
//    1, show the triangle and the nodes;
//    2, show the triangle, the nodes and number them.
//
//    Input, int POINT_NUM, the number of points.
//
//    Input, double POINT_XY[2*POINT_NUM], the coordinates of the 
//    points.
//
//    Input, int POINT_SHOW,
//    0, do not show the points;
//    1, show the points;
//    2, show the points and number them.
//
{
  int circle_size;
  int delta;
  std::ofstream file_unit;
  int i;
  int node;
  int node_num = 3;
  int point;
  double x_max;
  double x_min;
  int x_ps;
  int x_ps_max = 576;
  int x_ps_max_clip = 594;
  int x_ps_min = 36;
  int x_ps_min_clip = 18;
  double x_scale;
  double y_max;
  double y_min;
  int y_ps;
  int y_ps_max = 666;
  int y_ps_max_clip = 684;
  int y_ps_min = 126;
  int y_ps_min_clip = 108;
  double y_scale;
//
//  We need to do some figuring here, so that we can determine
//  the range of the data, and hence the height and width
//  of the piece of paper.
//
  x_max = -r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( x_max < node_xy[0+node*2] )
    {
      x_max = node_xy[0+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( x_max < point_xy[0+point*2] )
    {
      x_max = point_xy[0+point*2];
    }
  }

  x_min = r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( node_xy[0+node*2] < x_min )
    {
      x_min = node_xy[0+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( point_xy[0+point*2] < x_min )
    {
      x_min = point_xy[0+point*2];
    }
  }
  x_scale = x_max - x_min;

  x_max = x_max + 0.05 * x_scale;
  x_min = x_min - 0.05 * x_scale;
  x_scale = x_max - x_min;

  y_max = -r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( y_max < node_xy[1+node*2] )
    {
      y_max = node_xy[1+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( y_max < point_xy[1+point*2] )
    {
      y_max = point_xy[1+point*2];
    }
  }

  y_min = r8_huge ( );
  for ( node = 0; node < node_num; node++ )
  {
    if ( node_xy[1+node*2] < y_min )
    {
      y_min = node_xy[1+node*2];
    }
  }
  for ( point = 0; point < point_num; point++ )
  {
    if ( point_xy[1+point*2] < y_min )
    {
      y_min = point_xy[1+point*2];
    }
  }
  y_scale = y_max - y_min;

  y_max = y_max + 0.05 * y_scale;
  y_min = y_min - 0.05 * y_scale;
  y_scale = y_max - y_min;

  if ( x_scale < y_scale )
  {
    delta = r8_nint ( double( x_ps_max - x_ps_min ) 
      * ( y_scale - x_scale ) / ( 2.0 * y_scale ) );

    x_ps_max = x_ps_max - delta;
    x_ps_min = x_ps_min + delta;

    x_ps_max_clip = x_ps_max_clip - delta;
    x_ps_min_clip = x_ps_min_clip + delta;

    x_scale = y_scale;
  }
  else if ( y_scale < x_scale )
  {
    delta = r8_nint ( double( y_ps_max - y_ps_min ) 
      * ( x_scale - y_scale ) / ( 2.0 * x_scale ) );

    y_ps_max      = y_ps_max - delta;
    y_ps_min      = y_ps_min + delta;

    y_ps_max_clip = y_ps_max_clip - delta;
    y_ps_min_clip = y_ps_min_clip + delta;

    y_scale = x_scale;
  }

  file_unit.open ( file_name );

  if ( !file_unit )
  {
    std::cerr << "\n";
    std::cerr << "TRIANGLE_POINTS_PLOT - Fatal error!\n";
    std::cerr << "  Could not open the output EPS file.\n";
    exit ( 1 );
  }

  file_unit << "%//PS-Adobe-3.0 EPSF-3.0\n";
  file_unit << "%%Creator: triangulation_order3_plot.C\n";
  file_unit << "%%Title: " << file_name << "\n";
  file_unit << "%%Pages: 1\n";
  file_unit << "%%BoundingBox:  "
    << x_ps_min << "  "
    << y_ps_min << "  "
    << x_ps_max << "  "
    << y_ps_max << "\n";
  file_unit << "%%Document-Fonts: Times-Roman\n";
  file_unit << "%%LanguageLevel: 1\n";
  file_unit << "%%EndComments\n";
  file_unit << "%%BeginProlog\n";
  file_unit << "/inch {72 mul} def\n";
  file_unit << "%%EndProlog\n";
  file_unit << "%%Page: 1 1\n";
  file_unit << "save\n";
  file_unit << "%\n";
  file_unit << "%  Set the RGB line color to very light gray.\n";
  file_unit << "%\n";
  file_unit << "0.900  0.900  0.900 setrgbcolor\n";
  file_unit << "%\n";
  file_unit << "%  Draw a gray border around the page.\n";
  file_unit << "%\n";
  file_unit << "newpath\n";
  file_unit << x_ps_min << "  "
            << y_ps_min << "  moveto\n";
  file_unit << x_ps_max << "  "
            << y_ps_min << "  lineto\n";
  file_unit << x_ps_max << "  "
            << y_ps_max << "  lineto\n";
  file_unit << x_ps_min << "  "
            << y_ps_max << "  lineto\n";
  file_unit << x_ps_min << "  "
            << y_ps_min << "  lineto\n";
  file_unit << "stroke\n";
  file_unit << "%\n";
  file_unit << "%  Set the RGB color to black.\n";
  file_unit << "%\n";
  file_unit << "0.000  0.000  0.000 setrgbcolor\n";
  file_unit << "%\n";
  file_unit << "%  Set the font and its size.\n";
  file_unit << "%\n";
  file_unit << "/Times-Roman findfont\n";
  file_unit << "0.50 inch scalefont\n";
  file_unit << "setfont\n";
  file_unit << "%\n";
  file_unit << "%  Print a title.\n";
  file_unit << "%\n";
  file_unit << "%  210  702  moveto\n";
  file_unit << "%  (Triangulation)  show\n";
  file_unit << "%\n";
  file_unit << "%  Define a clipping polygon.\n";
  file_unit << "%\n";
  file_unit << "newpath\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_min_clip << "  moveto\n";
  file_unit << x_ps_max_clip << "  "
            << y_ps_min_clip << "  lineto\n";
  file_unit << x_ps_max_clip << "  "
            << y_ps_max_clip << "  lineto\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_max_clip << "  lineto\n";
  file_unit << x_ps_min_clip << "  "
            << y_ps_min_clip << "  lineto\n";
  file_unit << "clip newpath\n";
//
//  Draw the triangle.
//
  if ( 0 <= node_show )
  {
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to red.\n";
    file_unit << "%\n";
    file_unit << "0.900  0.200  0.100 setrgbcolor\n";
    file_unit << "%\n";
    file_unit << "%  Draw the triangle.\n";
    file_unit << "%\n";

    file_unit << "newpath\n";

    for ( i = 0; i <= 3; i++ )
    {
      node = i4_wrap ( i, 0, 2 );

      x_ps = ( r8_nint ) ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (         node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = ( r8_nint ) ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      if ( i == 0 )
      {
        file_unit << x_ps << "  " << y_ps << "  moveto\n";
      }
      else
      {
        file_unit << x_ps << "  " << y_ps << "  lineto\n";
      }
    }
    file_unit << "stroke\n";
  }
//
//  Draw the nodes.
//
  if ( 1 <= node_show )
  {
    circle_size = 5;

    file_unit << "%\n";
    file_unit << "%  Draw filled dots at the nodes.\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to blue.\n";
    file_unit << "%\n";
    file_unit << "0.000  0.150  0.750 setrgbcolor\n";
    file_unit << "%\n";

    for ( node = 0; node < 3; node++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (         node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      file_unit << "newpath  " << x_ps 
                << "  " << y_ps
                << "  " << circle_size
                << "  0 360 arc closepath fill\n";
    }
  }
//
//  Label the nodes.
//
  if ( 2 <= node_show )
  {
    file_unit << "%\n";
    file_unit << "%  Label the nodes:\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to darker blue.\n";
    file_unit << "%\n";
    file_unit << "0.000  0.250  0.850 setrgbcolor\n";
    file_unit << "/Times-Roman findfont\n";
    file_unit << "0.20 inch scalefont\n";
    file_unit << "setfont\n";
    file_unit << "%\n";

    for ( node = 0; node < node_num; node++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - node_xy[0+node*2]         ) * double( x_ps_min )   
        + (       + node_xy[0+node*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                     - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - node_xy[1+node*2]         ) * double( y_ps_min )   
        + (         node_xy[1+node*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                     - y_min ) );

      file_unit  << "  " << x_ps
                 << "  " << y_ps + 5
                 << "  moveto (" << node+1 << ") show\n";
    }
  }
//
//  Draw the points.
//
  if ( point_num <= 200 )
  {
    circle_size = 5;
  }
  else if ( point_num <= 500 )
  {
    circle_size = 4;
  }
  else if ( point_num <= 1000 )
  {
    circle_size = 3;
  }
  else if ( point_num <= 5000 )
  {
    circle_size = 2;
  }
  else
  {
    circle_size = 1;
  }

  if ( 1 <= point_show )
  {
    file_unit << "%\n";
    file_unit << "%  Draw filled dots at the points.\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to green.\n";
    file_unit << "%\n";
    file_unit << "0.150  0.750  0.000 setrgbcolor\n";
    file_unit << "%\n";

    for ( point = 0; point < point_num; point++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - point_xy[0+point*2]         ) * double( x_ps_min )   
        + (         point_xy[0+point*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                       - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - point_xy[1+point*2]         ) * double( y_ps_min )   
        + (         point_xy[1+point*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                       - y_min ) );

      file_unit << "newpath  " << x_ps 
                << "  " << y_ps
                << "  " << circle_size
                << "  0 360 arc closepath fill\n";
    }
  }
//
//  Label the points.
//
  if ( 2 <= point_show )
  {
    file_unit << "%\n";
    file_unit << "%  Label the point:\n";
    file_unit << "%\n";
    file_unit << "%  Set the RGB color to darker green.\n";
    file_unit << "%\n";
    file_unit << "0.250  0.850  0.000 setrgbcolor\n";
    file_unit << "/Times-Roman findfont\n";
    file_unit << "0.20 inch scalefont\n";
    file_unit << "setfont\n";
    file_unit << "%\n";

    for ( point = 0; point < point_num; point++ )
    {
      x_ps = r8_nint ( 
        ( ( x_max - point_xy[0+point*2]         ) * double( x_ps_min )   
        + (       + point_xy[0+point*2] - x_min ) * double( x_ps_max ) ) 
        / ( x_max                       - x_min ) );

      y_ps = r8_nint ( 
        ( ( y_max - point_xy[1+point*2]         ) * double( y_ps_min )   
        + (         point_xy[1+point*2] - y_min ) * double( y_ps_max ) ) 
        / ( y_max                       - y_min ) );

      file_unit << "  " << x_ps
                << "  " << y_ps + 5
                << "  moveto (" << point+1 << ") show\n";
    }
  }

  file_unit << "%\n";
  file_unit << "restore  showpage\n";
  file_unit << "%\n";
  file_unit << "%  End of page.\n";
  file_unit << "%\n";
  file_unit << "%%Trailer\n";
  file_unit << "%%EOF\n";

  file_unit.close ( );

  return;
}